

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# liveness.cpp
# Opt level: O3

uint32_t __thiscall
spvtools::opt::analysis::LivenessManager::AnalyzeAccessChainLoc
          (LivenessManager *this,Instruction *ac,uint32_t curr_type_id,uint32_t *offset,bool *no_loc
          ,bool is_patch,bool input)

{
  DefUseManager *pDVar1;
  DecorationManager *pDVar2;
  pointer pOVar3;
  uint **ppuVar4;
  char cVar5;
  Analysis AVar6;
  ExecutionModel EVar7;
  uint **ppuVar8;
  bool bVar9;
  IRContext *pIVar10;
  IRContext *this_00;
  pointer pOVar11;
  uint32_t ocnt;
  uint32_t local_74;
  undefined8 *local_70;
  undefined8 local_68;
  code *local_60;
  code *local_58;
  uint32_t *local_50;
  bool *local_48;
  uint *local_40;
  undefined4 local_34;
  
  pIVar10 = this->ctx_;
  AVar6 = pIVar10->valid_analyses_;
  this_00 = pIVar10;
  local_74 = curr_type_id;
  local_50 = offset;
  local_48 = no_loc;
  if ((AVar6 & kAnalysisBegin) == kAnalysisNone) {
    IRContext::BuildDefUseManager(pIVar10);
    this_00 = this->ctx_;
    AVar6 = this_00->valid_analyses_;
  }
  pDVar1 = (pIVar10->def_use_mgr_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
           .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>._M_head_impl;
  pIVar10 = this_00;
  if ((AVar6 & kAnalysisDecorations) == kAnalysisNone) {
    IRContext::BuildDecorationManager(this_00);
    pIVar10 = this->ctx_;
  }
  pDVar2 = (this_00->decoration_mgr_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::analysis::DecorationManager,_std::default_delete<spvtools::opt::analysis::DecorationManager>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::analysis::DecorationManager_*,_std::default_delete<spvtools::opt::analysis::DecorationManager>_>
           .super__Head_base<0UL,_spvtools::opt::analysis::DecorationManager_*,_false>._M_head_impl;
  EVar7 = IRContext::GetStage(pIVar10);
  bVar9 = EVar7 - ExecutionModelTessellationControl < 3;
  if (!input) {
    bVar9 = EVar7 == ExecutionModelTessellationControl;
  }
  local_34 = 0;
  local_68 = 0;
  local_70 = (undefined8 *)operator_new(0x40);
  *local_70 = this;
  local_70[1] = &local_34;
  local_70[2] = pDVar1;
  local_70[3] = pDVar2;
  local_70[4] = &local_74;
  local_70[5] = local_50;
  local_70[6] = local_48;
  *(char *)(local_70 + 7) = !is_patch & bVar9;
  local_58 = std::
             _Function_handler<bool_(const_unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/liveness.cpp:188:26)>
             ::_M_invoke;
  local_60 = std::
             _Function_handler<bool_(const_unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/liveness.cpp:188:26)>
             ::_M_manager;
  pOVar11 = (ac->operands_).
            super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
            _M_impl.super__Vector_impl_data._M_start;
  pOVar3 = (ac->operands_).
           super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (pOVar11 != pOVar3) {
    do {
      if ((pOVar11->type & ~SPV_OPERAND_TYPE_ID) != SPV_OPERAND_TYPE_TYPE_ID) {
        ppuVar4 = (uint **)(pOVar11->words).large_data_._M_t.
                           super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                           .
                           super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                           ._M_head_impl;
        ppuVar8 = &(pOVar11->words).small_data_;
        if (ppuVar4 != (uint **)0x0) {
          ppuVar8 = ppuVar4;
        }
        local_40 = *ppuVar8;
        if (local_60 == (code *)0x0) {
          std::__throw_bad_function_call();
        }
        cVar5 = (*local_58)(&local_70,&local_40);
        if (cVar5 == '\0') break;
      }
      pOVar11 = pOVar11 + 1;
    } while (pOVar11 != pOVar3);
    if (local_60 == (code *)0x0) {
      return local_74;
    }
  }
  (*local_60)(&local_70,&local_70,3);
  return local_74;
}

Assistant:

uint32_t LivenessManager::AnalyzeAccessChainLoc(const Instruction* ac,
                                                uint32_t curr_type_id,
                                                uint32_t* offset, bool* no_loc,
                                                bool is_patch, bool input) {
  analysis::DefUseManager* def_use_mgr = context()->get_def_use_mgr();
  analysis::DecorationManager* deco_mgr = context()->get_decoration_mgr();
  // For tesc, tese and geom input variables, and tesc output variables,
  // first array index does not contribute to offset.
  auto stage = context()->GetStage();
  bool skip_first_index = false;
  if ((input && (stage == spv::ExecutionModel::TessellationControl ||
                 stage == spv::ExecutionModel::TessellationEvaluation ||
                 stage == spv::ExecutionModel::Geometry)) ||
      (!input && stage == spv::ExecutionModel::TessellationControl))
    skip_first_index = !is_patch;
  uint32_t ocnt = 0;
  ac->WhileEachInOperand([this, &ocnt, def_use_mgr, deco_mgr, &curr_type_id,
                          offset, no_loc,
                          skip_first_index](const uint32_t* opnd) {
    if (ocnt >= 1) {
      // Skip first index's contribution to offset if indicated
      Instruction* curr_type_inst = def_use_mgr->GetDef(curr_type_id);
      if (ocnt == 1 && skip_first_index) {
        assert(curr_type_inst->opcode() == spv::Op::OpTypeArray &&
               "unexpected wrapper type");
        const uint32_t kArrayElementTypeInIdx = 0;
        curr_type_id =
            curr_type_inst->GetSingleWordInOperand(kArrayElementTypeInIdx);
        ocnt++;
        return true;
      }
      // If any non-constant index, mark the entire current object and return.
      auto idx_inst = def_use_mgr->GetDef(*opnd);
      if (idx_inst->opcode() != spv::Op::OpConstant) return false;
      // If current type is struct, look for location decoration on member and
      // reset offset if found.
      auto index = idx_inst->GetSingleWordInOperand(0);
      if (curr_type_inst->opcode() == spv::Op::OpTypeStruct) {
        uint32_t loc = 0;
        bool no_mem_loc = deco_mgr->WhileEachDecoration(
            curr_type_id, uint32_t(spv::Decoration::Location),
            [&loc, index, no_loc](const Instruction& deco) {
              assert(deco.opcode() == spv::Op::OpMemberDecorate &&
                     "unexpected decoration");
              if (deco.GetSingleWordInOperand(kOpDecorateMemberMemberInIdx) ==
                  index) {
                loc =
                    deco.GetSingleWordInOperand(kOpDecorateMemberLocationInIdx);
                *no_loc = false;
                return false;
              }
              return true;
            });
        if (!no_mem_loc) {
          *offset = loc;
          curr_type_id = curr_type_inst->GetSingleWordInOperand(index);
          ocnt++;
          return true;
        }
      }

      // Update offset and current type based on constant index.
      *offset += GetLocOffset(index, curr_type_id);
      curr_type_id = GetComponentType(index, curr_type_id);
    }
    ocnt++;
    return true;
  });
  return curr_type_id;
}